

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmXe2_LPGCachePolicy::InitCachePolicy(GmmXe2_LPGCachePolicy *this)

{
  GMM_CACHE_POLICY_ELEMENT *pGVar1;
  uint uVar2;
  WA_TABLE *pWVar3;
  SKU_FEATURE_TABLE *pSVar4;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar5;
  GMM_PRIVATE_PAT *pGVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar10;
  undefined8 extraout_RDX_04;
  bool bVar11;
  GMM_PRIVATE_PAT PAT_3;
  GMM_PRIVATE_PAT PAT_2;
  GMM_PRIVATE_PAT PAT_1;
  GMM_PRIVATE_PAT PAT;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle;
  GMM_PTE_CACHE_CONTROL_BITS PTE;
  GMM_CACHE_POLICY_TBL_ELEMENT UsageEle;
  GMM_XE2_PRIVATE_PAT UsagePATElement;
  uint32_t j;
  uint32_t i;
  int32_t CoherentPATIdx;
  int32_t PATIdxCompressed;
  int32_t CPTblIdx;
  int32_t PATIdx;
  uint uStack_1c;
  bool CachePolicyError;
  uint32_t ReservedPATIdx;
  uint32_t Usage;
  GmmXe2_LPGCachePolicy *this_local;
  
  if (*(GMM_CACHE_POLICY_ELEMENT **)
       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18) ==
      (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffcffffffffffff | 0x3000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffcffffffffffff | 0x3000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffcffffffff;
    pWVar3 = Context::GetWaTable(*(Context **)
                                  ((long)&(this->super_GmmXe_LPGCachePolicy).
                                          super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8));
    bVar11 = true;
    if (((uint)((ulong)*(undefined8 *)&pWVar3->field_0x4 >> 0x39) & 1) == 0) {
      pWVar3 = Context::GetWaTable(*(Context **)
                                    ((long)&(this->super_GmmXe_LPGCachePolicy).
                                            super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                            super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8)
                                  );
      bVar11 = (*(ulong *)&pWVar3->field_0x4 >> 0x3a & 1) != 0;
    }
    iVar7 = 0;
    if (bVar11) {
      iVar7 = 2;
    }
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffff3ffffffff | (long)iVar7 << 0x22;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffcffffffff;
    pWVar3 = Context::GetWaTable(*(Context **)
                                  ((long)&(this->super_GmmXe_LPGCachePolicy).
                                          super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8));
    bVar11 = true;
    if (((uint)((ulong)*(undefined8 *)&pWVar3->field_0x4 >> 0x39) & 1) == 0) {
      pWVar3 = Context::GetWaTable(*(Context **)
                                    ((long)&(this->super_GmmXe_LPGCachePolicy).
                                            super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                            super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8)
                                  );
      bVar11 = (*(ulong *)&pWVar3->field_0x4 >> 0x3a & 1) != 0;
    }
    iVar7 = 0;
    if (bVar11) {
      iVar7 = 2;
    }
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffff3ffffffff | (long)iVar7 << 0x22
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffcffffffffffff | 0x3000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffcffffffffffff | 0x3000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value = pGVar1[0x11d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11d].field_1.Value =
         pGVar1[0x11d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x60].field_1.Value = pGVar1[0x60].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x61].field_1.Value = pGVar1[0x61].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[99].field_1.Value = pGVar1[99].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[100].field_1.Value = pGVar1[100].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf4].field_1.Value = pGVar1[0xf4].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value =
         pGVar1[0xf5].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf5].field_1.Value = pGVar1[0xf5].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffffffff3fffffff | 0x40000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value =
         pGVar1[0xf6].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf6].field_1.Value = pGVar1[0xf6].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value =
         pGVar1[0xf7].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf7].field_1.Value = pGVar1[0xf7].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf8].field_1.Value = pGVar1[0xf8].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value =
         pGVar1[0xf9].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xf9].field_1.Value = pGVar1[0xf9].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfa].field_1.Value = pGVar1[0xfa].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffffcffffffff | 0x200000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfffcffffffffffff | 0x3000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfb].field_1.Value = pGVar1[0xfb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfc].field_1.Value = pGVar1[0xfc].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value =
         pGVar1[0xfd].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfd].field_1.Value = pGVar1[0xfd].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value =
         pGVar1[0xfe].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xfe].field_1.Value = pGVar1[0xfe].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffffffff3fffffff | 0x40000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value =
         pGVar1[0xff].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0xff].field_1.Value = pGVar1[0xff].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value =
         pGVar1[0x100].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value = pGVar1[0x100].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x100].field_1.Value =
         pGVar1[0x100].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value = pGVar1[0x101].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x101].field_1.Value =
         pGVar1[0x101].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value =
         pGVar1[0x102].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value = pGVar1[0x102].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x102].field_1.Value =
         pGVar1[0x102].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value = pGVar1[0x103].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x103].field_1.Value =
         pGVar1[0x103].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value = pGVar1[0x104].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x104].field_1.Value =
         pGVar1[0x104].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value =
         pGVar1[0x105].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value = pGVar1[0x105].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x105].field_1.Value =
         pGVar1[0x105].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value = pGVar1[0x106].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x106].field_1.Value =
         pGVar1[0x106].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value = pGVar1[0x107].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x107].field_1.Value =
         pGVar1[0x107].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value =
         pGVar1[0x108].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value = pGVar1[0x108].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x108].field_1.Value =
         pGVar1[0x108].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value =
         pGVar1[0x109].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value = pGVar1[0x109].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x109].field_1.Value =
         pGVar1[0x109].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value =
         pGVar1[0x10a].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value = pGVar1[0x10a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10a].field_1.Value =
         pGVar1[0x10a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value = pGVar1[0x10b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10b].field_1.Value =
         pGVar1[0x10b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value = pGVar1[0x10c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10c].field_1.Value =
         pGVar1[0x10c].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffffcffffffff | 0x100000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfffffff3ffffffff;
    pSVar4 = Context::GetSkuTable
                       (*(Context **)
                         ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                 super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon + 8));
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value =
         pGVar1[0x10d].field_1.Value & 0xfffcffffffffffff |
         (ulong)(((ulong)pSVar4->field_1 >> 0x21 & 1) != 0) << 0x30;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value = pGVar1[0x10d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10d].field_1.Value =
         pGVar1[0x10d].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffffcffffffff | 0x200000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfffcffffffffffff | 0x3000000000000
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10e].field_1.Value = pGVar1[0x10e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value = pGVar1[0x10f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x10f].field_1.Value =
         pGVar1[0x10f].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfffcffffffffffff | 0x1000000000000
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value = pGVar1[0x110].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x110].field_1.Value =
         pGVar1[0x110].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value = pGVar1[0x111].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x111].field_1.Value =
         pGVar1[0x111].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value = pGVar1[0x112].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x112].field_1.Value =
         pGVar1[0x112].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfffcffffffffffff | 0x1000000000000
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value = pGVar1[0x113].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x113].field_1.Value =
         pGVar1[0x113].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfffcffffffffffff | 0x3000000000000
    ;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x114].field_1.Value = pGVar1[0x114].field_1.Value & 0xffefffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value = pGVar1[0x115].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x115].field_1.Value =
         pGVar1[0x115].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value = pGVar1[0x116].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x116].field_1.Value =
         pGVar1[0x116].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value = pGVar1[0x117].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x117].field_1.Value =
         pGVar1[0x117].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x118].field_1.Value =
         pGVar1[0x118].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x119].field_1.Value =
         pGVar1[0x119].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11a].field_1.Value =
         pGVar1[0x11a].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar1[0x11b].field_1.Value =
         pGVar1[0x11b].field_1.Value & 0xffefffffffffffff | 0x10000000000000;
    SetUpMOCSTable(this);
    SetupPAT(this);
    for (uStack_1c = 0; uStack_1c < 0x11e; uStack_1c = uStack_1c + 1) {
      PATIdxCompressed = -1;
      CoherentPATIdx = -1;
      i = 0xffffffff;
      j = 0xffffffff;
      memset(&UsageEle,0,4);
      PTE = (GMM_PTE_CACHE_CONTROL_BITS)0x0;
      GetL3L4(this,(GMM_CACHE_POLICY_TBL_ELEMENT *)&PTE.Gen6,(GMM_XE2_PRIVATE_PAT *)&UsageEle,
              uStack_1c);
      GmmXe_LPGCachePolicy::SetL1CachePolicy(&this->super_GmmXe_LPGCachePolicy,uStack_1c);
      pSVar4 = Context::GetSkuTable
                         (*(Context **)
                           ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                   super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                   super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                   super_GmmCachePolicyCommon + 8));
      if (((*(ushort *)&pSVar4->field_0 >> 8 & 1) == 0) &&
         (((ushort)PTE.field_4.HighDwordValue._0_2_ >> 4 & 3) == 1)) {
        PTE.Gen6 = PTE.Gen6 & 0xffffffcfffffffff;
      }
      if (((ushort)PTE.field_4.HighDwordValue._0_2_ >> 8 & 1) == 0) {
        CoherentPATIdx = 0;
      }
      else {
        UsageEle.L3 = (anon_union_2_3_6e525fdd_for_L3)0x1;
        UsageEle.HDCL1 = '\0';
        UsageEle._7_1_ = 0;
        for (; (uint)UsageEle._4_4_ <=
               (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               CurrentMaxMocsIndex; UsageEle._4_4_ = UsageEle._4_4_ + 1) {
          pGVar5 = Context::GetCachePolicyTlbElement
                             (*(Context **)
                               ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                       super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                       super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                       super_GmmCachePolicyCommon + 8));
          if ((((((ushort)PTE.field_4.HighDwordValue._0_2_ >> 2 & 3) ==
                 (pGVar5[(uint)UsageEle._4_4_].L3.UshortValue >> 2 & 3)) &&
               (((ushort)PTE.field_4.HighDwordValue._0_2_ >> 4 & 3) ==
                (pGVar5[(uint)UsageEle._4_4_].L3.UshortValue >> 4 & 3))) &&
              (((ushort)PTE.field_4.HighDwordValue._0_2_ >> 6 & 3) ==
               (pGVar5[(uint)UsageEle._4_4_].L3.UshortValue >> 6 & 3))) &&
             (((ushort)PTE.field_4.HighDwordValue._0_2_ >> 8 & 1) == 1)) {
            CoherentPATIdx._0_2_ = UsageEle.L3;
            CoherentPATIdx._2_1_ = UsageEle.HDCL1;
            CoherentPATIdx._3_1_ = UsageEle._7_1_;
            break;
          }
        }
      }
      pSVar4 = Context::GetSkuTable
                         (*(Context **)
                           ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                   super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                   super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                   super_GmmCachePolicyCommon + 8));
      if (((*(ushort *)&pSVar4->field_0 >> 8 & 1) == 0) &&
         ((UsageEle.LeCC.DwordValue >> 4 & 3) == 1)) {
        UsageEle.LeCC.DwordValue = UsageEle.LeCC.DwordValue & 0xffffffcf;
      }
      if (((UsageEle.LeCC.DwordValue >> 2 & 3) == 1) && ((UsageEle.LeCC.DwordValue >> 4 & 3) == 1))
      {
        pSVar4 = Context::GetSkuTable
                           (*(Context **)
                             ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                     super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                     super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                     super_GmmCachePolicyCommon + 8));
        uVar10 = extraout_RDX_00;
        if (((ulong)pSVar4->field_1 >> 0x21 & 1) == 0) {
          PATIdxCompressed = 0xd;
        }
        else {
          PATIdxCompressed = 6;
        }
      }
      else {
        uVar10 = extraout_RDX;
        for (UsagePATElement.Value = 0;
            UsagePATElement.Value <=
            *(uint *)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.field_0x2c;
            UsagePATElement.Value = UsagePATElement.Value + 1) {
          pGVar6 = GmmGen8CachePolicy::GetPrivatePATEntry
                             ((GMM_PRIVATE_PAT *)this,
                              (GmmGen8CachePolicy *)(ulong)UsagePATElement.Value,(uint32_t)uVar10);
          uVar2 = (uint)pGVar6;
          uVar10 = extraout_RDX_01;
          if (((((UsageEle.LeCC.DwordValue >> 2 & 3) == (uVar2 >> 2 & 3)) &&
               ((UsageEle.LeCC.DwordValue & 3) == (uVar2 & 3))) &&
              ((UsageEle.LeCC.DwordValue >> 4 & 3) == (uVar2 >> 4 & 3))) &&
             (((UsageEle.LeCC.DwordValue >> 6 & 3) == (uVar2 >> 6 & 3) && ((uVar2 >> 9 & 1) == 0))))
          {
            PATIdxCompressed = UsagePATElement.Value;
            break;
          }
        }
      }
      for (UsagePATElement.Value = 0;
          UsagePATElement.Value <=
          *(uint *)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.field_0x2c;
          UsagePATElement.Value = UsagePATElement.Value + 1) {
        pGVar6 = GmmGen8CachePolicy::GetPrivatePATEntry
                           ((GMM_PRIVATE_PAT *)this,
                            (GmmGen8CachePolicy *)(ulong)UsagePATElement.Value,(uint32_t)uVar10);
        uVar2 = (uint)pGVar6;
        uVar10 = extraout_RDX_02;
        if ((((UsageEle.LeCC.DwordValue >> 2 & 3) == (uVar2 >> 2 & 3)) &&
            ((UsageEle.LeCC.DwordValue & 3) == (uVar2 & 3))) &&
           (((UsageEle.LeCC.DwordValue >> 4 & 3) == (uVar2 >> 4 & 3) &&
            (((UsageEle.LeCC.DwordValue >> 6 & 3) == (uVar2 >> 6 & 3) && ((uVar2 >> 9 & 1) == 1)))))
           ) {
          i = UsagePATElement.Value;
          break;
        }
      }
      bVar11 = PATIdxCompressed == -1;
      if (bVar11) {
        PATIdxCompressed = -1;
      }
      if (((UsageEle.LeCC.DwordValue & 3) == 2) || ((UsageEle.LeCC.DwordValue & 3) == 3)) {
        j = PATIdxCompressed;
      }
      else {
        for (UsagePATElement.Value = 0;
            UsagePATElement.Value <=
            *(uint *)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.field_0x2c;
            UsagePATElement.Value = UsagePATElement.Value + 1) {
          pGVar6 = GmmGen8CachePolicy::GetPrivatePATEntry
                             ((GMM_PRIVATE_PAT *)this,
                              (GmmGen8CachePolicy *)(ulong)UsagePATElement.Value,(uint32_t)uVar10);
          uVar2 = (uint)pGVar6;
          uVar10 = extraout_RDX_03;
          if (((((UsageEle.LeCC.DwordValue >> 2 & 3) == (uVar2 >> 2 & 3)) &&
               ((UsageEle.LeCC.DwordValue >> 4 & 3) == (uVar2 >> 4 & 3))) &&
              ((UsageEle.LeCC.DwordValue >> 6 & 3) == (uVar2 >> 6 & 3))) && ((uVar2 & 3) == 2)) {
            if (((uVar2 >> 9 & 1) == 0) && (j == 0xffffffff)) {
              j = UsagePATElement.Value;
            }
            if (j != 0xffffffff) break;
          }
        }
        if (j == 0xffffffff) {
          for (UsagePATElement.Value = 0;
              UsagePATElement.Value <=
              *(uint *)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.field_0x2c;
              UsagePATElement.Value = UsagePATElement.Value + 1) {
            pGVar6 = GmmGen8CachePolicy::GetPrivatePATEntry
                               ((GMM_PRIVATE_PAT *)this,
                                (GmmGen8CachePolicy *)(ulong)UsagePATElement.Value,(uint32_t)uVar10)
            ;
            uVar2 = (uint)pGVar6;
            if ((((uVar2 >> 2 & 3) == 3) && ((uVar2 >> 4 & 3) == 3)) &&
               (((UsageEle.LeCC.DwordValue >> 6 & 3) == (uVar2 >> 6 & 3) && ((uVar2 & 3) == 2)))) {
              if (((uVar2 >> 9 & 1) == 0) && (j == 0xffffffff)) {
                j = UsagePATElement.Value;
              }
              if (j != 0xffffffff) break;
            }
            uVar10 = extraout_RDX_04;
          }
        }
      }
      (*(GMM_CACHE_POLICY_ELEMENT **)
        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[uStack_1c].field_3.
      PATIndex = PATIdxCompressed;
      pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
      pGVar1[uStack_1c].field_1.Value =
           pGVar1[uStack_1c].field_1.Value & 0xfffffe0fffffffff | (long)(int)(j & 0x1f) << 0x24;
      pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
      pGVar1[uStack_1c].field_1.Value =
           pGVar1[uStack_1c].field_1.Value & 0xfffffdffffffffff | ((long)((int)j >> 5) & 1U) << 0x29
      ;
      pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
      pGVar1[uStack_1c].field_1.Value =
           pGVar1[uStack_1c].field_1.Value & 0xffff03ffffffffff | ((long)(int)i & 0x3fU) << 0x2a;
      uVar2 = 0;
      if ((PATIdxCompressed & 4U) != 0) {
        uVar2 = 0x80;
      }
      uVar8 = 0;
      if ((PATIdxCompressed & 2U) != 0) {
        uVar8 = 0x10;
      }
      uVar9 = 0;
      if ((PATIdxCompressed & 1U) != 0) {
        uVar9 = 8;
      }
      (*(GMM_CACHE_POLICY_ELEMENT **)
        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[uStack_1c].PTE.field_4.
      DwordValue = uVar2 | uVar8 | uVar9;
      uVar2 = 0;
      if ((PATIdxCompressed & 0x10U) != 0) {
        uVar2 = 0x20000000;
      }
      uVar8 = 0;
      if ((PATIdxCompressed & 8U) != 0) {
        uVar8 = 0x40000000;
      }
      (*(GMM_CACHE_POLICY_ELEMENT **)
        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[uStack_1c].PTE.field_4.
      HighDwordValue = uVar2 | uVar8;
      pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
      pGVar1[uStack_1c].MemoryObjectOverride.DwordValue =
           pGVar1[uStack_1c].MemoryObjectOverride.DwordValue & 0xffffff81 |
           (CoherentPATIdx & 0x3fU) << 1;
      pGVar1 = *(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
      pGVar1[uStack_1c].MemoryObjectOverride.DwordValue =
           pGVar1[uStack_1c].MemoryObjectOverride.DwordValue & 0xfffffffe;
      (*(GMM_CACHE_POLICY_ELEMENT **)
        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[uStack_1c].Override =
           0xffffffff;
      if (bVar11 || CoherentPATIdx == -1) {
        return GMM_INVALIDPARAM;
      }
    }
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmXe2_LPGCachePolicy::InitCachePolicy()
{
    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, l3_cc, l3_clos, l1cc, l2cc, l4cc, coherency, igPAT, segov) DEFINE_CP_ELEMENT(usage, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, segov, 0, 0, l1cc, l2cc, l4cc, coherency, l3_cc, l3_clos, igPAT)

#include "GmmXe2_LPGCachePolicy.h"

    SetUpMOCSTable();
    SetupPAT();

    // Define index of cache element
    uint32_t Usage          = 0;
    uint32_t ReservedPATIdx = 13; /* Rsvd PAT section 13-19 */

#if (_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
    void *pKmdGmmContext = NULL;
#if (defined(__GMM_KMD__))
    pKmdGmmContext = pGmmLibContext->GetGmmKmdContext();
#endif
    OverrideCachePolicy(pKmdGmmContext);
#endif
    // Process the cache policy and fill in the look up table
    for (; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        bool                         CachePolicyError = false;
        int32_t                      PATIdx = -1, CPTblIdx = -1, PATIdxCompressed = -1, CoherentPATIdx = -1;
        uint32_t                     i, j;
        GMM_XE2_PRIVATE_PAT          UsagePATElement = {0};
        GMM_CACHE_POLICY_TBL_ELEMENT UsageEle        = {0};
        GMM_PTE_CACHE_CONTROL_BITS   PTE             = {0};

        // MOCS data
        {

            // Get L3 ,L4 and Convert  GMM indicative values to actual regiser values.
            GetL3L4(&UsageEle, &UsagePATElement, Usage);
            // Convert L1  GMM indicative values to actual regiser values and store into pCachePolicy to return to UMD's.
            SetL1CachePolicy(Usage);

            if ((!pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush) && (UsageEle.L3.PhysicalL3.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {
                UsageEle.L3.PhysicalL3.L3CC = GMM_GFX_PHY_L3_MT_WB; // No Transient Flush Support
            }

            /* If MOCS is not needed fall back to Defer to PAT i.e MOCS#0 */
            if (false == UsageEle.L3.PhysicalL3.igPAT)
            {
                /* Set cache policy index to defered to PAT i.e. MOCS Index 0 */
                CPTblIdx = 0;
            }
            else
            {
                /* MOCS Index 1-3 are valid */
                for (j = 1; j <= CurrentMaxMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if (UsageEle.L3.PhysicalL3.L4CC == TblEle->L3.PhysicalL3.L4CC &&
                        UsageEle.L3.PhysicalL3.L3CC == TblEle->L3.PhysicalL3.L3CC &&
                        UsageEle.L3.PhysicalL3.L3CLOS == TblEle->L3.PhysicalL3.L3CLOS &&
                        UsageEle.L3.PhysicalL3.igPAT == true)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            if (CPTblIdx == -1)
            {

                {
                    /* Invalid MOCS setting Fail the GMM Initialzation */
                    GMM_ASSERTDPF(false, "CRITICAL: Cache Policy Usage value for L3/L4 specified by Client is not defined in Fixed MOCS Table");
                    CachePolicyError = true;

                }
            }
        }

        /*
            Validate Caching restrictions as below
            1. MemoryType WB-XD must be used in Non-Coherent and allowed only for displayable surfaces
            2. Coherent mode(1-way/2-way) must be Memory Type WB
            3. No 2-way coherency on dGPU
            4. Memory Type WT is available only for L4 in Non Coherent Mode
            5. Memory Type UC must be used in Non-Coherent Mode
        */

        // PAT data
        {
            if (!pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush && (UsagePATElement.Xe2.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {
                UsagePATElement.Xe2.L3CC = GMM_GFX_PHY_L3_MT_WB; // No Transient Flush Support
            }

            /* Find a PATIndex from the PAT table for uncompressed case*/
            if ((UsagePATElement.Xe2.L4CC == GMM_GFX_PHY_L4_MT_WT) && (UsagePATElement.Xe2.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {

                // With L3:XD, L4:WT, NC combination
                if (pGmmLibContext->GetSkuTable().FtrDiscrete)
                {
                    // On BMG, L4 is a pass through, demote L4 to UC, keep L3 at XD
                    PATIdx = PAT6;
                }
                else
                {
                    // On LNL, L3:XD is not needed
                    PATIdx = PAT13;
                }
            }
            else
            {
                for (i = 0; i <= CurrentMaxPATIndex; i++)
                {
                    GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                    if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                        UsagePATElement.Xe2.Coherency == PAT.Xe2.Coherency &&
                        UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                        UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                        false == PAT.Xe2.LosslessCompressionEn)
                    {
                        PATIdx = i;
                        break;
                    }
                }
            }

            /* Find a PATIndex from the PAT table for compressed case*/
            for (i = 0; i <= CurrentMaxPATIndex; i++)
            {
                GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                    UsagePATElement.Xe2.Coherency == PAT.Xe2.Coherency &&
                    UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                    UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                    true == PAT.Xe2.LosslessCompressionEn)
                {
                    PATIdxCompressed = i;
                    break;
                }
            }

            if (PATIdx == -1)
            {
// Didn't find the caching settings in one of the already programmed PAT table entries.
// Need to add a new lookup table entry.
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support NumPATRegisters = %d)",
                    CurrentMaxPATIndex);
                    CachePolicyError = true;

                    PATIdx = GMM_PAT_ERROR;
            }

            /* Find a PATIndex for a coherent uncompressed case, if usage is 2-way or 1-way already, take that, otherwise search for oneway*/
            if ((UsagePATElement.Xe2.Coherency == GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP) ||
                (UsagePATElement.Xe2.Coherency == GMM_GFX_PHY_COHERENT_TWO_WAY_IA_GPU_SNOOP))
            {
                //Already coherent
                CoherentPATIdx = PATIdx;
            }
            else
            {
                // search for equivalent one way coherent index
                for (i = 0; i <= CurrentMaxPATIndex; i++)
                {
                    GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                    if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                        UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                        UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                        GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP == PAT.Xe2.Coherency)
                    {
                        if ((false == PAT.Xe2.LosslessCompressionEn) && (CoherentPATIdx == -1))
                        {
                            CoherentPATIdx = i;
                        }
                        if (CoherentPATIdx != -1)
                        {
                            break;
                        }
                    }
                }
                if (CoherentPATIdx == -1)
                {
                    //redo matching based on L3:UC, L4:UC, we should find one
                    for (i = 0; i <= CurrentMaxPATIndex; i++)
                    {
                        GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                        if (GMM_GFX_PHY_L4_MT_UC == PAT.Xe2.L4CC &&
                            GMM_GFX_PHY_L3_MT_UC == PAT.Xe2.L3CC &&
                            UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                            GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP == PAT.Xe2.Coherency)
                        {
                            if ((false == PAT.Xe2.LosslessCompressionEn) && (CoherentPATIdx == -1))
                            {
                                CoherentPATIdx = i;
                            }

                            if (CoherentPATIdx != -1)
                            {
                                break;
                            }
                        }
                    }
                }
            }
        }

        pCachePolicy[Usage].PATIndex                                 = PATIdx;
        pCachePolicy[Usage].CoherentPATIndex                         = GET_COHERENT_PATINDEX_LOWER_BITS(CoherentPATIdx); // Coherent uncompressed lower bits
        pCachePolicy[Usage].CoherentPATIndexHigherBit                = GET_COHERENT_PATINDEX_HIGHER_BIT(CoherentPATIdx); // Coherent uncompressed higher bits
        pCachePolicy[Usage].PATIndexCompressed                       = PATIdxCompressed;
        pCachePolicy[Usage].PTE.DwordValue                           = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) & 0xFFFFFFFF;
        pCachePolicy[Usage].PTE.HighDwordValue                       = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) >> 32;
        pCachePolicy[Usage].MemoryObjectOverride.XE_HP.Index         = CPTblIdx;
        pCachePolicy[Usage].MemoryObjectOverride.XE_HP.EncryptedData = 0;
        pCachePolicy[Usage].Override                                 = ALWAYS_OVERRIDE;


        if (CachePolicyError)
        {
            GMM_ASSERTDPF(false, "Cache Policy Init Error: Invalid Cache Programming ");

            return GMM_INVALIDPARAM;
        }
    }
    return GMM_SUCCESS;
}